

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline_client_transporter.cpp
# Opt level: O1

bool __thiscall
PipelineClientTransporter::Connect(PipelineClientTransporter *this,string *name,string *err)

{
  char *pcVar1;
  bool bVar2;
  uv_connect_t *req;
  string fullName;
  size_t len;
  unique_lock<std::mutex> lock;
  char *local_860;
  char *local_858;
  char local_850 [16];
  size_t local_840;
  unique_lock<std::mutex> local_838 [128];
  
  local_858 = (char *)0x0;
  local_850[0] = '\0';
  local_840 = 0x800;
  local_860 = local_850;
  uv_os_tmpdir((char *)local_838,&local_840);
  pcVar1 = local_858;
  strlen((char *)local_838);
  std::__cxx11::string::_M_replace((ulong)&local_860,0,pcVar1,(ulong)local_838);
  std::__cxx11::string::append((char *)&local_860);
  std::__cxx11::string::_M_append((char *)&local_860,(ulong)(name->_M_dataplus)._M_p);
  (this->uvClient).data = this;
  req = (uv_connect_t *)malloc(0x60);
  req->data = this;
  uv_pipe_init((this->super_Transporter).loop,&this->uvClient,0);
  uv_pipe_connect(req,&this->uvClient,local_860,onPipeConnectionCB);
  Transporter::StartEventLoop(&this->super_Transporter);
  local_838[0]._M_device = &this->mutex;
  local_838[0]._M_owns = false;
  std::unique_lock<std::mutex>::lock(local_838);
  local_838[0]._M_owns = true;
  std::condition_variable::wait((unique_lock *)&this->cv);
  bVar2 = Transporter::IsConnected(&this->super_Transporter);
  std::unique_lock<std::mutex>::~unique_lock(local_838);
  if (local_860 != local_850) {
    operator_delete(local_860);
  }
  return bVar2;
}

Assistant:

bool PipelineClientTransporter::Connect(const std::string& name, std::string& err) {
	std::string fullName;
#ifdef _WIN32
	{
		fullName = "\\\\.\\pipe\\emmylua-";
		fullName.append(name);
	}
#else
	{
		char tmp[2048];
		size_t len = sizeof(tmp);
		uv_os_tmpdir(tmp, &len);
		fullName = tmp;
		fullName.append("/");
		fullName.append(name);
	}
#endif

	uvClient.data = this;
	const auto req = (uv_connect_t*)malloc(sizeof(uv_connect_t));
	req->data = this;
	uv_pipe_init(loop, &uvClient, 0);
	uv_pipe_connect(req, &uvClient, fullName.c_str(), onPipeConnectionCB);
	StartEventLoop();

	std::unique_lock<std::mutex> lock(mutex);
	cv.wait(lock);
	return IsConnected();
}